

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XMLReader::getUpToCharOrWS(XMLReader *this,XMLBuffer *toFill,XMLCh toCheck)

{
  XMLCh XVar1;
  ulong uVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 in_EAX;
  undefined6 in_register_00000012;
  bool bVar7;
  bool bVar8;
  XMLCh curCh;
  undefined4 uStack_38;
  undefined4 local_34;
  
  _uStack_38 = CONCAT44((int)CONCAT62(in_register_00000012,toCheck),in_EAX);
  do {
    while( true ) {
      uVar5 = _uStack_38;
      uVar2 = this->fCharIndex;
      uVar3 = this->fCharsAvail;
      if (uVar3 <= uVar2) break;
      XVar1 = this->fCharBuf[uVar2];
      uStack_38 = CONCAT22(XVar1,(undefined2)uStack_38);
      uVar6 = _uStack_38;
      bVar8 = (char)this->fgCharCharsTable[(ushort)XVar1] < '\0';
      local_34._0_2_ = SUB82(uVar5,4);
      bVar7 = XVar1 == (XMLCh)local_34;
      if (bVar7 || bVar8) goto LAB_002c5795;
      this->fCharIndex = uVar2 + 1;
      _uStack_38 = uVar6;
      if ((XVar1 & 0xdf52U) == 0) {
        handleEOL(this,(XMLCh *)((long)&uStack_38 + 2),false);
      }
      else {
        this->fCurCol = this->fCurCol + 1;
      }
      XVar1 = uStack_38._2_2_;
      if (toFill->fIndex == toFill->fCapacity) {
        XMLBuffer::ensureCapacity(toFill,1);
      }
      XVar4 = toFill->fIndex;
      toFill->fIndex = XVar4 + 1;
      toFill->fBuffer[XVar4] = XVar1;
      if (bVar7 || bVar8) goto LAB_002c5795;
    }
    bVar7 = refreshCharBuffer(this);
  } while (bVar7);
LAB_002c5795:
  return uVar2 < uVar3;
}

Assistant:

bool XMLReader::getUpToCharOrWS(XMLBuffer& toFill, const XMLCh toCheck)
{
    while (true)
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            // Get the current char out of the buffer
            XMLCh curCh = fCharBuf[fCharIndex];

            //
            //  See if its not a white space or our target char, then process
            //  it. Else, we need to return.
            //
            if (!isWhitespace(curCh) && (curCh != toCheck))
            {
                // Eat this char
                fCharIndex++;

                //
                //  'curCh' is not a whitespace(x20|x9|xD|xA), so we only can
                //  have end-of-line combinations with a leading chNEL(x85) or
                //  chLineSeparator(x2028)
                //
                //  0010000000101000 chLineSeparator
                //  0000000010000101 chNEL
                //  ---------------------
                //  1101111101010010 == ~(chNEL|chLineSeparator)
                //
                //  if the result of the logical-& operation is
                //  true  : 'curCh' can not be chNEL or chLineSeparator
                //  false : 'curCh' can be chNEL or chLineSeparator
                //
                if ( curCh & (XMLCh) ~(chNEL|chLineSeparator) )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, false);
                }

                // Add it to our buffer
                toFill.append(curCh);
            }
             else
            {
                return true;
            }
        }

        //
        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
        //
        if (!refreshCharBuffer())
            break;
    }

    // We never hit any non-space and ate up the whole reader
    return false;

}